

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefVectorOf<xercesc_4_0::IdentityConstraint> **objToLoad,int initSize,bool toAdopt,
               XSerializeEngine *serEng)

{
  byte bVar1;
  bool bVar2;
  MemoryManager *pMVar3;
  RefVectorOf<xercesc_4_0::IdentityConstraint> *this;
  XMLSize_t maxElems;
  IdentityConstraint *toAdd;
  IdentityConstraint *data;
  XMLSize_t i;
  XMLSize_t vectorLength;
  XSerializeEngine *local_20;
  XSerializeEngine *serEng_local;
  bool toAdopt_local;
  RefVectorOf<xercesc_4_0::IdentityConstraint> **ppRStack_10;
  int initSize_local;
  RefVectorOf<xercesc_4_0::IdentityConstraint> **objToLoad_local;
  
  local_20 = serEng;
  serEng_local._3_1_ = toAdopt;
  serEng_local._4_4_ = initSize;
  ppRStack_10 = objToLoad;
  bVar2 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar2) {
    if (*ppRStack_10 == (RefVectorOf<xercesc_4_0::IdentityConstraint> *)0x0) {
      if (serEng_local._4_4_ < 0) {
        serEng_local._4_4_ = 0x10;
      }
      pMVar3 = XSerializeEngine::getMemoryManager(local_20);
      this = (RefVectorOf<xercesc_4_0::IdentityConstraint> *)XMemory::operator_new(0x30,pMVar3);
      bVar1 = serEng_local._3_1_;
      maxElems = (XMLSize_t)serEng_local._4_4_;
      pMVar3 = XSerializeEngine::getMemoryManager(local_20);
      RefVectorOf<xercesc_4_0::IdentityConstraint>::RefVectorOf
                (this,maxElems,(bool)(bVar1 & 1),pMVar3);
      *ppRStack_10 = this;
    }
    XSerializeEngine::registerObject(local_20,*ppRStack_10);
    i = 0;
    XSerializeEngine::readSize(local_20,&i);
    for (data = (IdentityConstraint *)0x0; data < i;
        data = (IdentityConstraint *)((long)&(data->super_XSerializable)._vptr_XSerializable + 1)) {
      toAdd = IdentityConstraint::loadIC(local_20);
      BaseRefVectorOf<xercesc_4_0::IdentityConstraint>::addElement
                (&(*ppRStack_10)->super_BaseRefVectorOf<xercesc_4_0::IdentityConstraint>,toAdd);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefVectorOf<IdentityConstraint>** objToLoad
                                   , int                                initSize
                                   , bool                               toAdopt
                                   , XSerializeEngine&                  serEng)
{

    if (serEng.needToLoadObject((void**)objToLoad))
    {
        if (!*objToLoad)
        {
            if (initSize < 0)
                initSize = 16;

            *objToLoad = new (serEng.getMemoryManager())
                             RefVectorOf<IdentityConstraint>(
                                                             initSize
                                                           , toAdopt
                                                           , serEng.getMemoryManager()
                                                            );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t vectorLength = 0;
        serEng.readSize (vectorLength);
        for (XMLSize_t i = 0 ; i < vectorLength; i++)
        {
            IdentityConstraint*  data;
            data = IdentityConstraint::loadIC(serEng);
            (*objToLoad)->addElement(data);
        }
    }

}